

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_starter_test.cpp
# Opt level: O2

int main(void)

{
  test_location<void_(*)()> test;
  allocator<char> local_79;
  code *local_78;
  char *pcStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  test local_60;
  SubdirectoryDisposer directory;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"approval_tests",&local_79)
  ;
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::useApprovalsSubdirectory(&directory,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  local_78 = main::anon_class_1_0_00000001::__invoke;
  pcStack_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/examples/ut_starter/ut_starter_test.cpp"
  ;
  local_68 = 0xd;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_60,"Starter",7);
  test.location._12_4_ = uStack_64;
  test.location.line_ = local_68;
  test.location.file_ = pcStack_70;
  test.test = local_78;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_60,test);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_60.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  ApprovalTests::SubdirectoryDisposer::~SubdirectoryDisposer(&directory);
  return 0;
}

Assistant:

int main()
{
    using namespace boost::ut;
    using namespace ApprovalTests;

    // This puts "received" and "approved" files in approval_tests/ sub-directory,
    // keeping the test source directory tidy:
    auto directory = Approvals::useApprovalsSubdirectory("approval_tests");

    "Starter"_test = []() {
        // TODO Replace 42 with the value or object whose contents you are verifying.
        // For help, see:
        // https://approvaltestscpp.readthedocs.io/en/latest/generated_docs/ToString.html
        Approvals::verify(42);
    };
}